

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O3

int archive_read_extract_cleanup(archive_read *a)

{
  int iVar1;
  archive_read_extract *__ptr;
  
  __ptr = a->extract;
  if (__ptr->ad == (archive *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = archive_write_free(__ptr->ad);
    __ptr = a->extract;
  }
  free(__ptr);
  a->extract = (archive_read_extract *)0x0;
  return iVar1;
}

Assistant:

static int
archive_read_extract_cleanup(struct archive_read *a)
{
	int ret = ARCHIVE_OK;

	if (a->extract->ad != NULL) {
		ret = archive_write_free(a->extract->ad);
	}
	free(a->extract);
	a->extract = NULL;
	return (ret);
}